

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_pcg_serial.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint onoff;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  N_Vector v_vec;
  void *flagvalue;
  N_Vector p_Var11;
  long lVar12;
  SUNLinearSolver S;
  char *__s;
  long lVar13;
  sunrealtype sVar14;
  uint local_74;
  N_Vector local_70;
  double local_68;
  ulong local_60;
  SUNContext sunctx;
  void *local_50;
  UserData ProbData;
  
  iVar1 = SUNContext_Create(0,&sunctx);
  if (iVar1 == 0) {
    iVar1 = 1;
    if (argc < 5) {
      puts("ERROR: FOUR (4) Inputs required:");
      puts("  Problem size should be >0");
      puts("  Maximum Krylov subspace dimension should be >0");
      puts("  Solver tolerance should be >0");
      __s = "  timing output flag should be 0 or 1 ";
    }
    else {
      lVar10 = atol(argv[1]);
      problem_size = lVar10;
      ProbData.N = lVar10;
      if (lVar10 < 1) {
        __s = "ERROR: Problem size must be a positive integer";
      }
      else {
        uVar2 = atoi(argv[2]);
        if ((int)uVar2 < 1) {
          __s = "ERROR: Maximum Krylov subspace dimension must be a positive integer";
        }
        else {
          local_68 = atof(argv[3]);
          if (0.0 < local_68) {
            onoff = atoi(argv[4]);
            SetTiming(onoff);
            puts("\nPCG linear solver test:");
            printf("  Problem size = %ld\n",lVar10);
            printf("  Maximum Krylov subspace dimension = %i\n",(ulong)uVar2);
            printf("  Solver Tolerance = %g\n",local_68);
            printf("  timing output flag = %i\n\n",(ulong)onoff);
            v_vec = (N_Vector)N_VNew_Serial(lVar10,sunctx);
            iVar1 = check_flag(v_vec,"N_VNew_Serial",0);
            if (iVar1 != 0) {
              return 1;
            }
            flagvalue = (void *)N_VNew_Serial(lVar10,sunctx);
            iVar1 = check_flag(flagvalue,"N_VNew_Serial",0);
            if (iVar1 != 0) {
              return 1;
            }
            p_Var11 = (N_Vector)N_VNew_Serial(lVar10,sunctx);
            iVar1 = check_flag(p_Var11,"N_VNew_Serial",0);
            if (iVar1 != 0) {
              return 1;
            }
            local_70 = p_Var11;
            p_Var11 = (N_Vector)N_VNew_Serial(lVar10,sunctx);
            ProbData.d = p_Var11;
            iVar1 = check_flag(p_Var11,"N_VNew_Serial",0);
            if (iVar1 != 0) {
              return 1;
            }
            ProbData.s = (N_Vector)N_VNew_Serial(lVar10,sunctx);
            iVar1 = check_flag(ProbData.s,"N_VNew_Serial",0);
            if (iVar1 != 0) {
              return 1;
            }
            local_50 = flagvalue;
            lVar12 = N_VGetArrayPointer(flagvalue);
            for (lVar13 = 0; lVar13 < lVar10; lVar13 = lVar13 + 1) {
              sVar14 = urand();
              *(double *)(lVar12 + lVar13 * 8) = sVar14 + 1.0;
            }
            N_VConst(0x4014000000000000,p_Var11);
            S = (SUNLinearSolver)SUNLinSol_PCG(v_vec,2,uVar2);
            iVar1 = Test_SUNLinSolGetType(S,SUNLINEARSOLVER_ITERATIVE,0);
            iVar3 = Test_SUNLinSolGetID(S,SUNLINEARSOLVER_PCG,0);
            iVar4 = Test_SUNLinSolSetATimes(S,&ProbData,ATimes,0);
            iVar5 = Test_SUNLinSolSetPreconditioner(S,&ProbData,PSetup,PSolve,0);
            iVar6 = Test_SUNLinSolSetScalingVectors(S,ProbData.s,(N_Vector)0x0,0);
            iVar7 = Test_SUNLinSolSetZeroGuess(S,0);
            iVar8 = Test_SUNLinSolInitialize(S,0);
            iVar9 = Test_SUNLinSolSpace(S,0);
            uVar2 = iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar1;
            if (uVar2 != 0) {
              printf("FAIL: SUNLinSol_PCG module failed %i initialization tests\n\n",(ulong)uVar2);
              return 1;
            }
            puts("SUCCESS: SUNLinSol_PCG module passed all initialization tests\n");
            N_VConst(0x3ff0000000000000,ProbData.s);
            N_VProd(local_50,ProbData.s,v_vec);
            local_74 = ATimes(&ProbData,v_vec,local_70);
            iVar1 = check_flag(&local_74,"ATimes",1);
            if (iVar1 != 0) {
              return 1;
            }
            local_60 = 0;
            iVar1 = SUNLinSol_PCGSetPrecType(S);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
            p_Var11 = local_70;
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,local_70,local_68,1,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,p_Var11,local_68,0,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolLastFlag(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolNumIters(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolResNorm(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolResid(S,0);
            local_74 = iVar1 + local_74;
            if (local_74 == 0) {
              puts("SUCCESS: SUNLinSol_PCG module, problem 1, passed all tests\n");
            }
            else {
              printf("FAIL: SUNLinSol_PCG module, problem 1, failed %i tests\n\n",(ulong)local_74);
              local_60 = 1;
            }
            N_VConst(0x3ff0000000000000,ProbData.s);
            N_VProd(local_50,ProbData.s,v_vec);
            local_74 = ATimes(&ProbData,v_vec,local_70);
            iVar1 = check_flag(&local_74,"ATimes",1);
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = SUNLinSol_PCGSetPrecType(S);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
            p_Var11 = local_70;
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,local_70,local_68,1,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,p_Var11,local_68,0,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolLastFlag(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolNumIters(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolResNorm(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolResid(S,0);
            local_74 = iVar1 + local_74;
            if (local_74 == 0) {
              puts("SUCCESS: SUNLinSol_PCG module, problem 2, passed all tests\n");
            }
            else {
              printf("FAIL: SUNLinSol_PCG module, problem 2, failed %i tests\n\n",(ulong)local_74);
              local_60 = (ulong)((int)local_60 + 1);
            }
            lVar10 = N_VGetArrayPointer(ProbData.s);
            for (lVar12 = 0; lVar12 < ProbData.N; lVar12 = lVar12 + 1) {
              sVar14 = urand();
              *(double *)(lVar10 + lVar12 * 8) = sVar14 * 1000.0 + 1.0;
            }
            N_VProd(local_50,ProbData.s,v_vec);
            local_74 = ATimes(&ProbData,v_vec,local_70);
            iVar1 = check_flag(&local_74,"ATimes",1);
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = SUNLinSol_PCGSetPrecType(S);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
            p_Var11 = local_70;
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,local_70,local_68,1,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,p_Var11,local_68,0,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolLastFlag(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolNumIters(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolResNorm(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolResid(S,0);
            local_74 = iVar1 + local_74;
            if (local_74 == 0) {
              puts("SUCCESS: SUNLinSol_PCG module, problem 3, passed all tests\n");
            }
            else {
              printf("FAIL: SUNLinSol_PCG module, problem 3, failed %i tests\n\n",(ulong)local_74);
              local_60 = (ulong)((int)local_60 + 1);
            }
            lVar10 = N_VGetArrayPointer(ProbData.s);
            for (lVar12 = 0; lVar12 < ProbData.N; lVar12 = lVar12 + 1) {
              sVar14 = urand();
              *(double *)(lVar10 + lVar12 * 8) = sVar14 * 1000.0 + 1.0;
            }
            N_VProd(local_50,ProbData.s,v_vec);
            local_74 = ATimes(&ProbData,v_vec,local_70);
            iVar1 = check_flag(&local_74,"ATimes",1);
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = SUNLinSol_PCGSetPrecType(S);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
            p_Var11 = local_70;
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,local_70,local_68,1,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,p_Var11,local_68,0,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolLastFlag(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolNumIters(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolResNorm(S,0);
            local_74 = local_74 + iVar1;
            iVar1 = Test_SUNLinSolResid(S,0);
            local_74 = iVar1 + local_74;
            if (local_74 == 0) {
              puts("SUCCESS: SUNLinSol_PCG module, problem 4, passed all tests\n");
            }
            else {
              printf("FAIL: SUNLinSol_PCG module, problem 4, failed %i tests\n\n",(ulong)local_74);
              local_60 = (ulong)((int)local_60 + 1);
            }
            SUNLinSolFree(S);
            N_VDestroy(v_vec);
            N_VDestroy(local_50);
            N_VDestroy(local_70);
            N_VDestroy(ProbData.d);
            N_VDestroy(ProbData.s);
            SUNContext_Free(&sunctx);
            return (int)local_60;
          }
          __s = "ERROR: Solver tolerance must be a positive real number";
        }
      }
    }
    puts(__s);
  }
  else {
    puts("ERROR: SUNContext_Create failed");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails    = 0;    /* counter for test failures */
  int passfail = 0;    /* overall pass/fail flag    */
  SUNLinearSolver LS;  /* linear solver object      */
  N_Vector xhat, x, b; /* test vectors              */
  UserData ProbData;   /* problem data structure    */
  int maxl, print_timing;
  sunindextype i;
  sunrealtype* vecdata;
  double tol;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check inputs: local problem size, timing flag */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required:\n");
    printf("  Problem size should be >0\n");
    printf("  Maximum Krylov subspace dimension should be >0\n");
    printf("  Solver tolerance should be >0\n");
    printf("  timing output flag should be 0 or 1 \n");
    return 1;
  }
  ProbData.N   = (sunindextype)atol(argv[1]);
  problem_size = ProbData.N;
  if (ProbData.N <= 0)
  {
    printf("ERROR: Problem size must be a positive integer\n");
    return 1;
  }
  maxl = atoi(argv[2]);
  if (maxl <= 0)
  {
    printf(
      "ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
    return 1;
  }
  tol = atof(argv[3]);
  if (tol <= ZERO)
  {
    printf("ERROR: Solver tolerance must be a positive real number\n");
    return 1;
  }
  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nPCG linear solver test:\n");
  printf("  Problem size = %ld\n", (long int)ProbData.N);
  printf("  Maximum Krylov subspace dimension = %i\n", maxl);
  printf("  Solver Tolerance = %g\n", tol);
  printf("  timing output flag = %i\n\n", print_timing);

  /* Create vectors */
  x = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(x, "N_VNew_Serial", 0)) { return 1; }
  xhat = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(xhat, "N_VNew_Serial", 0)) { return 1; }
  b = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(b, "N_VNew_Serial", 0)) { return 1; }
  ProbData.d = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.d, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s, "N_VNew_Serial", 0)) { return 1; }

  /* Fill xhat vector with uniform random data in [1,2] */
  vecdata = N_VGetArrayPointer(xhat);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + urand(); }

  /* Fill Jacobi vector with matrix diagonal */
  N_VConst(FIVE, ProbData.d);

  /* Create PCG linear solver */
  LS = SUNLinSol_PCG(x, SUN_PREC_RIGHT, maxl, sunctx);
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_ITERATIVE, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_PCG, 0);
  fails += Test_SUNLinSolSetATimes(LS, &ProbData, ATimes, 0);
  fails += Test_SUNLinSolSetPreconditioner(LS, &ProbData, PSetup, PSolve, 0);
  fails += Test_SUNLinSolSetScalingVectors(LS, ProbData.s, NULL, 0);
  fails += Test_SUNLinSolSetZeroGuess(LS, 0);
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module failed %i initialization tests\n\n",
           fails);
    return 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module passed all initialization tests\n\n");
  }

  /*** Test 1: simple Poisson-like solve (no preconditioning) ***/

  /* set scaling vector */
  N_VConst(ONE, ProbData.s);

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run test with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 1, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 1, passed all tests\n\n");
  }

  /*** Test 2: simple Poisson-like solve (Jacobi preconditioning) ***/

  /* set scaling vector */
  N_VConst(ONE, ProbData.s);

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 2, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 2, passed all tests\n\n");
  }

  /*** Test 3: Poisson-like solve w/ scaling (no preconditioning) ***/

  /* set scaling vector */
  vecdata = N_VGetArrayPointer(ProbData.s);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 3, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 3, passed all tests\n\n");
  }

  /*** Test 4: Poisson-like solve w/ scaling (Jacobi preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 4, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 4, passed all tests\n\n");
  }

  /* Free solver and vectors */
  SUNLinSolFree(LS);
  N_VDestroy(x);
  N_VDestroy(xhat);
  N_VDestroy(b);
  N_VDestroy(ProbData.d);
  N_VDestroy(ProbData.s);
  SUNContext_Free(&sunctx);

  return (passfail);
}